

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
          SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *other)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ValueLength __n;
  ValueLength VVar6;
  ValueLength size;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffb0;
  undefined1 local_9;
  
  puVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      0x1149ad);
  puVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      0x1149bc);
  if (puVar4 == puVar5) {
    local_9 = true;
  }
  else {
    uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x1149dd);
    uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x1149ee);
    if (uVar1 == uVar2) {
      __n = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      (in_stack_ffffffffffffffb0);
      VVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                        (in_stack_ffffffffffffffb0);
      if (__n == VVar6) {
        puVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                           ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                            0x114a43);
        puVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                           ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                            0x114a52);
        iVar3 = memcmp(puVar4,puVar5,__n);
        local_9 = iVar3 == 0;
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = false;
    }
  }
  return local_9;
}

Assistant:

bool binaryEquals(SliceBase<S, T> const& other) const {
    if (start() == other.start()) {
      // same underlying data, so the slices must be identical
      return true;
    }

    if (head() != other.head()) {
      return false;
    }

    ValueLength const size = byteSize();

    if (size != other.byteSize()) {
      return false;
    }

    return (std::memcmp(start(), other.start(), checkOverflow(size)) == 0);
  }